

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fatcat.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool listDeleted_;
  bool bVar22;
  int iVar23;
  uint cluster;
  uint uVar24;
  uint uVar25;
  char *extraout_RAX;
  ostream *poVar26;
  unsigned_long_long uVar27;
  string *this;
  string *backupFile_00;
  uint *puVar28;
  EVP_PKEY_CTX *ctx;
  FatPath *this_00;
  char *pcVar29;
  ulong uVar30;
  uint local_538;
  OutputFormatType local_534;
  uint local_530;
  uint local_52c;
  int local_528;
  uint local_524;
  unsigned_long_long local_480;
  bool isContiguous;
  undefined7 uStack_45f;
  FatPath path;
  char local_400;
  unsigned_long_long local_3f8;
  unsigned_long_long local_3c0;
  string local_3b0 [8];
  int local_3a8;
  char *local_390;
  string backupFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string entryPath;
  string listPath;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string error;
  unsigned_long_long local_160;
  string extractDirectory;
  string readPath;
  FatPath path_2;
  string local_70;
  string local_50;
  
  uVar30 = (ulong)(uint)argc;
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  listPath._M_dataplus._M_p = (pointer)&listPath.field_2;
  listPath._M_string_length = 0;
  listPath.field_2._M_local_buf[0] = '\0';
  readPath._M_dataplus._M_p = (pointer)&readPath.field_2;
  readPath._M_string_length = 0;
  extractDirectory._M_dataplus._M_p = (pointer)&extractDirectory.field_2;
  extractDirectory._M_string_length = 0;
  readPath.field_2._M_local_buf[0] = '\0';
  extractDirectory.field_2._M_local_buf[0] = '\0';
  backupFile._M_dataplus._M_p = (pointer)&backupFile.field_2;
  backupFile._M_string_length = 0;
  entryPath._M_dataplus._M_p = (pointer)&entryPath.field_2;
  entryPath._M_string_length = 0;
  backupFile.field_2._M_local_buf[0] = '\0';
  bVar4 = false;
  entryPath.field_2._M_local_buf[0] = '\0';
  local_52c = 0xffffffff;
  puVar28 = &switchD_0010bd4c::switchdataD_00116004;
  bVar5 = false;
  bVar6 = false;
  bVar7 = false;
  cluster = 0;
  listDeleted_ = false;
  bVar8 = false;
  bVar9 = false;
  bVar10 = false;
  bVar11 = false;
  bVar14 = false;
  bVar15 = false;
  bVar16 = false;
  bVar17 = false;
  bVar20 = false;
  local_538 = 0;
  bVar22 = false;
  bVar18 = false;
  bVar12 = false;
  bVar19 = false;
  bVar1 = false;
  bVar2 = false;
  local_528 = 0;
  bVar21 = false;
  bVar13 = false;
  local_534 = Default;
  bVar3 = false;
  local_480 = 0;
switchD_0010bd4c_caseD_41:
  iVar23 = getopt(argc,argv,"il:L:r:R:s:dc:hx:2@:ob:p:w:v:mt:Sze:O:fk:a:F:");
  pcVar29 = _optarg;
  switch(iVar23) {
  case 0x40:
    cluster = atoi(_optarg);
    bVar10 = true;
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x50:
  case 0x51:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x67:
  case 0x6a:
  case 0x6e:
  case 0x71:
  case 0x75:
  case 0x79:
    goto switchD_0010bd4c_caseD_41;
  case 0x46:
    break;
  case 0x4c:
    local_524 = atoi(_optarg);
    bVar5 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x4f:
    local_480 = atoll(_optarg);
    goto switchD_0010bd4c_caseD_41;
  case 0x52:
    cluster = atoi(_optarg);
    bVar7 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x53:
    bVar22 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x61:
    local_528 = atoi(_optarg);
    bVar21 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x62:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,_optarg,(allocator<char> *)&path);
    std::__cxx11::string::operator=((string *)&backupFile,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
    bVar14 = true;
    goto switchD_0010bd4c_caseD_41;
  case 99:
    cluster = atoi(_optarg);
    bVar1 = true;
    goto switchD_0010bd4c_caseD_41;
  case 100:
    listDeleted_ = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x65:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,_optarg,(allocator<char> *)&path);
    std::__cxx11::string::operator=((string *)&entryPath,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
    bVar19 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x66:
    bVar12 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x68:
    goto switchD_0010bd4c_caseD_68;
  case 0x69:
    bVar3 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x6b:
    cluster = atoi(_optarg);
    bVar13 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x6c:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,_optarg,(allocator<char> *)&path);
    std::__cxx11::string::operator=((string *)&listPath,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
    bVar4 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x6d:
    bVar17 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x6f:
    bVar11 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x70:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,_optarg,(allocator<char> *)&path);
    std::__cxx11::string::operator=((string *)&backupFile,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
    bVar15 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x72:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,_optarg,(allocator<char> *)&path);
    std::__cxx11::string::operator=((string *)&readPath,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
    bVar6 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x73:
    local_52c = atoi(_optarg);
    bVar2 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x74:
    local_538 = atoi(_optarg);
    goto switchD_0010bd4c_caseD_41;
  case 0x76:
    local_530 = atoi(_optarg);
    bVar20 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x77:
    cluster = atoi(_optarg);
    bVar16 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x78:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,_optarg,(allocator<char> *)&path);
    std::__cxx11::string::operator=((string *)&extractDirectory,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
    bVar8 = true;
    goto switchD_0010bd4c_caseD_41;
  case 0x7a:
    bVar18 = true;
    goto switchD_0010bd4c_caseD_41;
  default:
    if (iVar23 == 0x32) {
      bVar9 = true;
    }
    else if (iVar23 == -1) {
      puVar28 = (uint *)(long)_optind;
      if ((_optind != argc) && (pcVar29 = argv[(long)puVar28], pcVar29 != (char *)0x0))
      goto LAB_0010c141;
      goto switchD_0010bd4c_caseD_68;
    }
    goto switchD_0010bd4c_caseD_41;
  }
  iVar23 = strcmp(_optarg,"json");
  local_534 = Json;
  if (iVar23 == 0) goto switchD_0010bd4c_caseD_41;
  iVar23 = strcmp(pcVar29,"default");
  local_534 = Default;
  if (iVar23 == 0) goto switchD_0010bd4c_caseD_41;
switchD_0010bd4c_caseD_68:
  do {
    argc = (int)uVar30;
    usage();
    pcVar29 = extraout_RAX;
LAB_0010c141:
    uVar30 = (ulong)argc;
    local_390 = pcVar29;
    while (puVar28 = (uint *)((long)puVar28 + 1), (long)puVar28 < (long)uVar30) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&error,argv[(long)puVar28],(allocator<char> *)&path);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arguments,
                 &error);
      std::__cxx11::string::~string((string *)&error);
    }
  } while (((((((!bVar3) && (!bVar4)) && (!bVar5)) && ((!bVar6 && (!bVar7)))) &&
            (((!bVar8 && ((!bVar9 && (!bVar10)))) && (!bVar11)))) &&
           ((((!bVar14 && (!bVar15)) && (!bVar16)) &&
            (((!bVar17 && (!bVar22)) && ((!bVar18 && ((!bVar19 && (!bVar12)))))))))) && (!bVar13));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,local_390,(allocator<char> *)&path);
  FatSystem::FatSystem((FatSystem *)&error,&local_288,local_480,local_534);
  std::__cxx11::string::~string((string *)&local_288);
  ctx = (EVP_PKEY_CTX *)(ulong)listDeleted_;
  FatSystem::setListDeleted((FatSystem *)&error,listDeleted_);
  iVar23 = FatSystem::init((FatSystem *)&error,ctx);
  if ((char)iVar23 == '\0') {
    poVar26 = std::operator<<((ostream *)&std::cerr,"! Failed to init the FAT filesystem");
    std::endl<char,std::char_traits<char>>(poVar26);
LAB_0010cd96:
    exit(1);
  }
  if (bVar3) {
    FatSystem::infos((FatSystem *)&error);
    goto LAB_0010c2b9;
  }
  if (bVar4) {
    if (local_534 == Default) {
      poVar26 = std::operator<<((ostream *)&std::cout,"Listing path ");
      poVar26 = std::operator<<(poVar26,(string *)&listPath);
      std::endl<char,std::char_traits<char>>(poVar26);
    }
    std::__cxx11::string::string((string *)&local_2a8,(string *)&listPath);
    FatPath::FatPath(&path,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    FatSystem::list((FatSystem *)&error,&path);
LAB_0010c41b:
    this_00 = &path;
LAB_0010c423:
    FatPath::~FatPath(this_00);
  }
  else {
    if (bVar5) {
      if (local_534 == Default) {
        poVar26 = std::operator<<((ostream *)&std::cout,"Listing cluster ");
        poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)poVar26);
        std::endl<char,std::char_traits<char>>(poVar26);
      }
      FatSystem::list((FatSystem *)&error,local_524);
      goto LAB_0010c2b9;
    }
    if (bVar6) {
      std::__cxx11::string::string((string *)&local_2c8,(string *)&readPath);
      FatPath::FatPath(&path,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      FatSystem::readFile((FatSystem *)&error,&path,(FILE *)0x0);
      goto LAB_0010c41b;
    }
    if (bVar7) {
      FatSystem::readFile((FatSystem *)&error,cluster,local_52c,(FILE *)0x0,false);
      goto LAB_0010c2b9;
    }
    if (bVar8) {
      FatExtract::FatExtract((FatExtract *)&path,(FatSystem *)&error);
      std::__cxx11::string::string((string *)&local_2e8,(string *)&extractDirectory);
      FatExtract::extract((FatExtract *)&path,cluster,&local_2e8,listDeleted_);
      std::__cxx11::string::~string((string *)&local_2e8);
      FatExtract::~FatExtract((FatExtract *)&path);
      goto LAB_0010c2b9;
    }
    if (bVar9) {
      FatDiff::FatDiff((FatDiff *)&path,(FatSystem *)&error);
      FatDiff::compare((FatDiff *)&path);
      goto LAB_0010c2b9;
    }
    if (bVar10) {
      poVar26 = std::operator<<((ostream *)&std::cout,"Cluster ");
      poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)poVar26);
      poVar26 = std::operator<<(poVar26," address:");
      std::endl<char,std::char_traits<char>>(poVar26);
      uVar27 = FatSystem::clusterAddress((FatSystem *)&error,cluster,false);
      printf("%llu (%016llx)\n",uVar27,uVar27);
      poVar26 = std::operator<<((ostream *)&std::cout,"Next cluster:");
      std::endl<char,std::char_traits<char>>(poVar26);
      uVar24 = FatSystem::nextCluster((FatSystem *)&error,cluster,0);
      uVar25 = FatSystem::nextCluster((FatSystem *)&error,cluster,1);
      printf("FAT1: %u (%08x)\n",(ulong)uVar24,(ulong)uVar24);
      printf("FAT2: %u (%08x)\n",(ulong)uVar25,(ulong)uVar25);
      isContiguous = false;
      FatChains::FatChains((FatChains *)&path,(FatSystem *)&error);
      iVar23 = FatChains::chainSize((FatChains *)&path,cluster,&isContiguous);
      uVar27 = local_160 * (long)iVar23;
      prettySize_abi_cxx11_(&path_2.path,uVar27);
      printf("Chain size: %llu (%llu / %s)\n",(long)iVar23,uVar27,path_2.path._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&path_2);
      pcVar29 = "Chain is not contiguous";
      if (isContiguous != false) {
        pcVar29 = "Chain is contiguous";
      }
      puts(pcVar29);
    }
    else {
      if (!bVar11) {
        if (bVar12) {
          FatFix::FatFix((FatFix *)&path,(FatSystem *)&error);
          FatFix::fix((FatFix *)&path);
          goto LAB_0010c2b9;
        }
        if (bVar13) {
          FatSearch::FatSearch((FatSearch *)&path,(FatSystem *)&error);
          FatSearch::search((FatSearch *)&path,cluster);
          goto LAB_0010c2b9;
        }
        if ((bVar14) || (bVar15)) {
          FatBackup::FatBackup((FatBackup *)&path,(FatSystem *)&error);
          if (bVar14) {
            backupFile_00 = &local_50;
            std::__cxx11::string::string((string *)backupFile_00,(string *)&backupFile);
            FatBackup::backup((FatBackup *)&path,backupFile_00,local_538);
          }
          else {
            backupFile_00 = &local_70;
            std::__cxx11::string::string((string *)backupFile_00,(string *)&backupFile);
            FatBackup::patch((FatBackup *)&path,backupFile_00,local_538);
          }
          std::__cxx11::string::~string((string *)backupFile_00);
          goto LAB_0010c2b9;
        }
        if (bVar16) {
          if (!bVar20) {
            this = (string *)__cxa_allocate_exception(0x20);
            std::__cxx11::string::string<std::allocator<char>>
                      (this,"You should provide a value with -v",(allocator<char> *)&path);
            __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          uVar24 = FatSystem::nextCluster((FatSystem *)&error,cluster,0);
          printf("Writing next cluster of %u from %u to %u\n",(ulong)cluster,(ulong)uVar24);
          FatSystem::enableWrite((FatSystem *)&error);
          if (local_538 < 2) {
            puts("Writing on FAT1");
            FatSystem::writeNextCluster((FatSystem *)&error,cluster,local_530,0);
          }
          if ((local_538 & 0xfffffffd) == 0) {
            puts("Writing on FAT2");
            FatSystem::writeNextCluster((FatSystem *)&error,cluster,local_530,1);
          }
          goto LAB_0010c2b9;
        }
        if (bVar17) {
          FatDiff::FatDiff((FatDiff *)&path,(FatSystem *)&error);
          FatDiff::merge((FatDiff *)&path);
          goto LAB_0010c2b9;
        }
        if ((bVar22 != false) || (bVar18)) {
          FatSystem::enableWrite((FatSystem *)&error);
          FatSystem::rewriteUnallocated((FatSystem *)&error,bVar22);
          goto LAB_0010c2b9;
        }
        if (!bVar19) goto LAB_0010c2b9;
        poVar26 = std::operator<<((ostream *)&std::cout,"Searching entry for ");
        poVar26 = std::operator<<(poVar26,(string *)&entryPath);
        std::endl<char,std::char_traits<char>>(poVar26);
        std::__cxx11::string::string((string *)&local_308,(string *)&entryPath);
        FatPath::FatPath(&path_2,&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        FatEntry::FatEntry((FatEntry *)&path);
        bVar22 = FatSystem::findFile((FatSystem *)&error,&path_2,(FatEntry *)&path);
        if (!bVar22) {
          poVar26 = std::operator<<((ostream *)&std::cerr,"Entry not found.");
          std::endl<char,std::char_traits<char>>(poVar26);
          goto LAB_0010cd96;
        }
        printf("Entry address %016llx\n",local_3c0);
        printf("Attributes %02X\n",(ulong)(uint)(int)local_400);
        poVar26 = std::operator<<((ostream *)&std::cout,"Found entry, cluster=");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar26);
        bVar22 = FatEntry::isDirectory((FatEntry *)&path);
        if (bVar22) {
          std::operator<<((ostream *)&std::cout,", directory");
        }
        else {
          poVar26 = std::operator<<((ostream *)&std::cout,", file with size=");
          poVar26 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar26);
          poVar26 = std::operator<<(poVar26," (");
          prettySize_abi_cxx11_((string *)&isContiguous,local_3f8);
          poVar26 = std::operator<<(poVar26,(string *)&isContiguous);
          std::operator<<(poVar26,")");
          std::__cxx11::string::~string((string *)&isContiguous);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        if (bVar1) {
          poVar26 = std::operator<<((ostream *)&std::cout,"Setting the cluster to ");
          poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)poVar26);
          std::endl<char,std::char_traits<char>>(poVar26);
        }
        if (bVar2) {
          poVar26 = std::operator<<((ostream *)&std::cout,"Setting the size to ");
          poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)poVar26);
          std::endl<char,std::char_traits<char>>(poVar26);
        }
        if (bVar21) {
          poVar26 = std::operator<<((ostream *)&std::cout,"Setting attributes to ");
          poVar26 = (ostream *)std::ostream::operator<<(poVar26,local_528);
          std::endl<char,std::char_traits<char>>(poVar26);
LAB_0010cb4b:
          FatEntry::updateData((FatEntry *)&path);
          FatSystem::enableWrite((FatSystem *)&error);
          std::__cxx11::string::string((string *)&isContiguous,local_3b0);
          FatSystem::writeData
                    ((FatSystem *)&error,local_3c0,(char *)CONCAT71(uStack_45f,isContiguous),
                     local_3a8);
          std::__cxx11::string::~string((string *)&isContiguous);
        }
        else if (bVar1 || bVar2) goto LAB_0010cb4b;
        FatEntry::~FatEntry((FatEntry *)&path);
        this_00 = &path_2;
        goto LAB_0010c423;
      }
      FatChains::FatChains((FatChains *)&path,(FatSystem *)&error);
      FatChains::chainsAnalysis((FatChains *)&path);
    }
    FatChains::~FatChains((FatChains *)&path);
  }
LAB_0010c2b9:
  FatSystem::~FatSystem((FatSystem *)&error);
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    vector<string> arguments;
    char *image = NULL;
    int index;

    // -O offset
    unsigned long long globalOffset = 0;

    // -s, specify the size to be read
    unsigned int size = -1;

    // -i, display information about the disk
    bool infoFlag = false;

    // -l, list directories in the given path
    bool listFlag = false;
    string listPath;

    // -c, listing for a direct cluster
    bool listClusterFlag = false;
    unsigned int listCluster;

    // -r, reads a file
    bool readFlag = false;
    string readPath;

    // -R, reads from cluster file
    bool clusterRead = false;
    unsigned int cluster = 0;

    // -d, lists deleted
    bool listDeleted = false;

    // -x: extract
    bool extract = false;
    string extractDirectory;

    // -2: compare two fats
    bool compare = false;

    // -@: get the cluster address
    bool address = false;

    // -k: analysis the chains
    bool chains = false;

    // -b: backup the fats
    bool backup = false;
    bool patch = false;
    string backupFile;

    // -w: write next cluster
    bool writeNext = false;

    // -m: merge the FATs
    bool merge = false;

    // -v: value
    bool hasValue = false;
    unsigned int value;

    // -t: FAT table to write or read
    unsigned int table = 0;

    // -S: write random data in unallocated sectors
    bool scramble = false;
    bool zero = false;

    // -f: fix reachable
    bool fixReachable = false;

    // -e: entry hacking
    bool entry = false;
    string entryPath;
    bool clusterProvided = false;
    bool sizeProvided = false;
    int attributes = 0;
    bool attributesProvided = false;

    // -k: entry finder
    bool findEntry = false;
    OutputFormatType outputFormat = Default;

    // Parsing command line
    while ((index = getopt(argc, argv, "il:L:r:R:s:dc:hx:2@:ob:p:w:v:mt:Sze:O:fk:a:F:")) != -1) {
        switch (index) {
        case 'a':
            attributesProvided = true;
            attributes = atoi(optarg);
            break;
        case 'k':
            findEntry = true;
            cluster = atoi(optarg);
            break;
        case 'f':
            fixReachable = true;
            break;
        case 'O':
            globalOffset = atoll(optarg);
            break;
        case 'e':
            entry = true;
            entryPath = string(optarg);
            break;
        case 'z':
            zero = true;
            break;
        case 'S':
            scramble = true;
            break;
        case 't':
            table = ATOU(optarg);
            break;
        case 'm':
            merge = true;
            break;
        case 'v':
            hasValue = true;
            value = ATOU(optarg);
            break;
        case 'w':
            writeNext = true;
            cluster = ATOU(optarg);
            break;
        case '@':
            address = true;
            cluster = ATOU(optarg);
            break;
        case 'o':
            chains = true;
            break;
        case 'i':
            infoFlag = true;
            break;
        case 'l':
            listFlag = true;
            listPath = string(optarg);
            break;
        case 'L':
            listClusterFlag = true;
            listCluster = ATOU(optarg);
            break;
        case 'r':
            readFlag = true;
            readPath = string(optarg);
            break;
        case 'R':
            clusterRead = true;
            cluster = ATOU(optarg);
            break;
        case 's':
            size = ATOU(optarg);
            sizeProvided = true;
            break;
        case 'd':
            listDeleted = true;
            break;
        case 'c':
            cluster = ATOU(optarg);
            clusterProvided = true;
            break;
        case 'x':
            extract = true;
            extractDirectory = string(optarg);
            break;
        case '2':
            compare = true;
            break;
        case 'b':
            backup = true;
            backupFile = string(optarg);
            break;
        case 'p':
            patch = true;
            backupFile = string(optarg);
            break;
        case 'h':
            usage();
            break;
        case 'F':
            if (strcmp(optarg, "json") == 0)
                outputFormat = Json;
            else if (strcmp(optarg, "default") == 0)
                outputFormat = Default;
            else
            {
                usage();
            }
            break;
        }
    }

    // Trying to get the FAT file or device
    if (optind != argc) {
        image = argv[optind];
    }

    if (!image) {
        usage();
    }

    // Getting extra arguments
    for (index=optind+1; index<argc; index++) {
        arguments.push_back(argv[index]);
    }

    // If the user did not required any actions
    if (!(infoFlag || listFlag || listClusterFlag || 
        readFlag || clusterRead || extract || compare || address ||
        chains || backup || patch || writeNext || merge ||
        scramble || zero || entry || fixReachable || findEntry)) {
        usage();
    }

    try {
        // Openning the image
        FatSystem fat(image, globalOffset, outputFormat);

        fat.setListDeleted(listDeleted);

        if (fat.init()) {
            if (infoFlag) {
                fat.infos();
            } else if (listFlag) {
                if (outputFormat != Json)
                    cout << "Listing path " << listPath << endl;
                FatPath path(listPath);
                fat.list(path);
            } else if (listClusterFlag) {
                if (outputFormat != Json)
                    cout << "Listing cluster " << listCluster << endl;
                fat.list(listCluster);
            } else if (readFlag) {
                FatPath path(readPath);
                fat.readFile(path);
            } else if (clusterRead) {
                fat.readFile(cluster, size);
            } else if (extract) {
                FatExtract extract(fat);
                extract.extract(cluster, extractDirectory, listDeleted);
            } else if (compare) {
                FatDiff diff(fat);
                diff.compare();
            } else if (address) {
                cout << "Cluster " << cluster << " address:" << endl;
                long long addr = fat.clusterAddress(cluster);
                printf("%llu (%016llx)\n", addr, addr);
                cout << "Next cluster:" << endl;
                int next1 = fat.nextCluster(cluster, 0);
                int next2 = fat.nextCluster(cluster, 1);
                printf("FAT1: %u (%08x)\n", next1, next1);
                printf("FAT2: %u (%08x)\n", next2, next2);
                bool isContiguous = false;

                FatChains chains(fat);
                unsigned long long size = chains.chainSize(cluster, &isContiguous);
                printf("Chain size: %llu (%llu / %s)\n", size, size*fat.bytesPerCluster, prettySize(size*fat.bytesPerCluster).c_str());
                if (isContiguous) {
                    printf("Chain is contiguous\n");
                } else {
                    printf("Chain is not contiguous\n");
                }
            } else if (chains) {
                FatChains chains(fat);
                chains.chainsAnalysis();
            } else if (fixReachable) {
                FatFix fix(fat);
                fix.fix();
            } else if (findEntry) {
                FatSearch search(fat);
                search.search(cluster);
            } else if (backup || patch) {
                FatBackup backupSystem(fat);
                
                if (backup) {
                    backupSystem.backup(backupFile, table);
                } else {
                    backupSystem.patch(backupFile, table);
                }
            } else if (writeNext) {
                if (!hasValue) {
                    throw string("You should provide a value with -v");
                }

                int prev = fat.nextCluster(cluster);
                printf("Writing next cluster of %u from %u to %u\n", cluster, prev, value);
                fat.enableWrite();

                if (table == 0 || table == 1) {
                    printf("Writing on FAT1\n");
                    fat.writeNextCluster(cluster, value, 0);
                } 
                if (table == 0 || table == 2) {
                    printf("Writing on FAT2\n");
                    fat.writeNextCluster(cluster, value, 1);
                } 
            } else if (merge) {
                FatDiff diff(fat);
                diff.merge();
            } else if (scramble) {
                fat.enableWrite();
                fat.rewriteUnallocated(1);
            } else if (zero) {
                fat.enableWrite();
                fat.rewriteUnallocated();
            } else if (entry) {
                cout << "Searching entry for " << entryPath << endl;
                FatPath path(entryPath);
                FatEntry entry;
                if (fat.findFile(path, entry)) {
                    printf("Entry address %016llx\n", entry.address);
                    printf("Attributes %02X\n", entry.attributes);
                    cout << "Found entry, cluster=" << entry.cluster;
                    if (entry.isDirectory()) {
                        cout << ", directory";
                    } else {
                        cout << ", file with size=" << entry.size << " (" << prettySize(entry.size) << ")";
                    }
                    cout << endl;

                    if (clusterProvided) {
                        cout << "Setting the cluster to " << cluster << endl;
                        entry.cluster = cluster;
                    }
                    if (sizeProvided) {
                        cout << "Setting the size to " << size << endl;
                        entry.size = size&0xffffffff;
                    }
                    if (attributesProvided) {
                        cout << "Setting attributes to " << attributes << endl;
                        entry.attributes = attributes;
                    }
                    if (clusterProvided || sizeProvided || attributesProvided) {
                        entry.updateData();
                        fat.enableWrite();
                        string data = entry.data;
                        fat.writeData(entry.address, data.c_str(), entry.data.size());
                    }
                } else {
                    cerr << "Entry not found." << endl;
                    exit(EXIT_FAILURE);
                }
            }
        } else {
            cerr << "! Failed to init the FAT filesystem" << endl;
            exit(EXIT_FAILURE);
        }
    } catch (string error) {
        cerr << "Error: " << error << endl;
        exit(EXIT_FAILURE);
    }

    exit(EXIT_SUCCESS);
}